

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

void __thiscall BinHash<TldAddressAsKey>::Clear(BinHash<TldAddressAsKey> *this)

{
  TldAddressAsKey *pTVar1;
  TldAddressAsKey *x;
  TldAddressAsKey **ppTVar2;
  uint32_t i;
  ulong uVar3;
  
  ppTVar2 = this->hashBin;
  if (ppTVar2 != (TldAddressAsKey **)0x0) {
    for (uVar3 = 0; uVar3 < this->tableSize; uVar3 = uVar3 + 1) {
      while (pTVar1 = ppTVar2[uVar3], pTVar1 != (TldAddressAsKey *)0x0) {
        ppTVar2[uVar3] = pTVar1->HashNext;
        operator_delete(pTVar1);
        ppTVar2 = this->hashBin;
      }
    }
    operator_delete__(ppTVar2);
    this->hashBin = (TldAddressAsKey **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }